

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feefrac.cpp
# Opt level: O1

partial_ordering CompareChunks(Span<const_FeeFrac> chunks0,Span<const_FeeFrac> chunks1)

{
  FeeFrac *pFVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  size_t sVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long *plVar19;
  bool bVar20;
  long in_FS_OFFSET;
  bool bVar21;
  bool better_somewhere [2];
  FeeFrac accum [2];
  size_t next_index [2];
  byte local_8a [2];
  long lStack_88;
  int local_80 [4];
  int local_70;
  size_t local_68 [2];
  FeeFrac *local_58;
  size_t local_50;
  FeeFrac *local_48;
  size_t local_40;
  long local_38;
  
  sVar15 = chunks0.m_size;
  sVar11 = chunks1.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = chunks0.m_data;
  local_50 = sVar15;
  local_48 = chunks1.m_data;
  local_40 = sVar11;
  local_68[0] = 0;
  local_68[1] = 0;
  lVar7 = 0;
  do {
    *(undefined8 *)((long)&lStack_88 + lVar7) = 0;
    *(undefined4 *)((long)local_80 + lVar7) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x20);
  local_8a[0] = 0;
  local_8a[1] = 0;
  do {
    bVar21 = local_68[0] == sVar15;
    iVar6 = 2;
    if (!bVar21 || local_68[1] != sVar11) {
      if (local_68[0] != sVar15 && local_68[1] != sVar11) {
        bVar21 = local_70 + chunks1.m_data[local_68[1]].size <
                 local_80[0] + chunks0.m_data[local_68[0]].size;
      }
      uVar4 = (ulong)bVar21;
      pFVar1 = (&local_58)[uVar4 * 2];
      plVar19 = &lStack_88 + uVar4 * 2;
      lVar17 = *plVar19 + pFVar1[local_68[bVar21]].fee;
      bVar20 = (bool)(bVar21 ^ 1);
      uVar5 = (ulong)bVar20;
      lVar7 = (&lStack_88)[uVar5 * 2];
      lVar12 = lVar17 - lVar7;
      if (local_68[0] != sVar15 && local_68[1] != sVar11) {
        iVar18 = pFVar1[local_68[bVar21]].size + local_80[uVar4 * 4];
        sVar2 = local_68[bVar20];
        lVar17 = (&local_58)[(ulong)bVar20 * 2][sVar2].fee;
        iVar6 = (&local_58)[(ulong)bVar20 * 2][sVar2].size;
        iVar16 = local_80[uVar5 * 4] + iVar6;
        uVar8 = iVar6 * lVar12;
        lVar12 = SUB168(SEXT816((long)iVar6) * SEXT816(lVar12),8);
        lVar13 = (long)(iVar18 - local_80[uVar5 * 4]);
        uVar9 = lVar17 * lVar13;
        lVar13 = SUB168(SEXT816(lVar17) * SEXT816(lVar13),8);
        uVar3 = (ulong)(uVar8 < uVar9);
        bVar10 = -((SBORROW8(lVar12,lVar13) != SBORROW8(lVar12 - lVar13,uVar3)) !=
                  (long)((lVar12 - lVar13) - uVar3) < 0) | 1;
        if (uVar8 == uVar9 && lVar12 == lVar13) {
          bVar10 = 0;
        }
        if (iVar16 == iVar18) {
          local_68[bVar20] = sVar2 + 1;
          (&lStack_88)[uVar5 * 2] = lVar17 + lVar7;
          local_80[uVar5 * 4] = iVar16;
        }
      }
      else {
        bVar10 = (byte)(lVar12 >> 0x3f) | 1;
        if (lVar17 == lVar7) {
          bVar10 = 0;
        }
      }
      bVar14 = bVar21;
      if ((bVar10 == 1) || (bVar14 = bVar20, bVar10 == 0xff)) {
        local_8a[bVar14] = 1;
      }
      sVar2 = local_68[bVar21];
      local_68[bVar21] = sVar2 + 1;
      *plVar19 = *plVar19 + pFVar1[sVar2].fee;
      local_80[uVar4 * 4] = local_80[uVar4 * 4] + pFVar1[sVar2].size;
      if (local_8a[0] == 1) {
        iVar6 = 1;
        if (local_8a[1] != '\0') goto LAB_00defea0;
      }
      iVar6 = 0;
    }
LAB_00defea0:
    if (iVar6 != 0) {
      if (iVar6 == 2) {
        bVar10 = -(local_8a[0] < local_8a[1]) | 1;
        if (local_8a[0] == local_8a[1]) {
          bVar10 = 0;
        }
      }
      else {
        bVar10 = 2;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (partial_ordering)bVar10;
    }
  } while( true );
}

Assistant:

std::partial_ordering CompareChunks(Span<const FeeFrac> chunks0, Span<const FeeFrac> chunks1)
{
    /** Array to allow indexed access to input diagrams. */
    const std::array<Span<const FeeFrac>, 2> chunk = {chunks0, chunks1};
    /** How many elements we have processed in each input. */
    size_t next_index[2] = {0, 0};
    /** Accumulated fee/sizes in diagrams, up to next_index[i] - 1. */
    FeeFrac accum[2];
    /** Whether the corresponding input is strictly better than the other at least in one place. */
    bool better_somewhere[2] = {false, false};
    /** Get the first unprocessed point in diagram number dia. */
    const auto next_point = [&](int dia) { return chunk[dia][next_index[dia]] + accum[dia]; };
    /** Get the last processed point in diagram number dia. */
    const auto prev_point = [&](int dia) { return accum[dia]; };
    /** Move to the next point in diagram number dia. */
    const auto advance = [&](int dia) { accum[dia] += chunk[dia][next_index[dia]++]; };

    do {
        bool done_0 = next_index[0] == chunk[0].size();
        bool done_1 = next_index[1] == chunk[1].size();
        if (done_0 && done_1) break;

        // Determine which diagram has the first unprocessed point. If a single side is finished, use the
        // other one. Only up to one can be done due to check above.
        const int unproc_side = (done_0 || done_1) ? done_0 : next_point(0).size > next_point(1).size;

        // Let `P` be the next point on diagram unproc_side, and `A` and `B` the previous and next points
        // on the other diagram. We want to know if P lies above or below the line AB. To determine this, we
        // compute the slopes of line AB and of line AP, and compare them. These slopes are fee per size,
        // and can thus be expressed as FeeFracs.
        const FeeFrac& point_p = next_point(unproc_side);
        const FeeFrac& point_a = prev_point(!unproc_side);

        const auto slope_ap = point_p - point_a;
        Assume(slope_ap.size > 0);
        std::weak_ordering cmp = std::weak_ordering::equivalent;
        if (done_0 || done_1) {
            // If a single side has no points left, act as if AB has slope tail_feerate(of 0).
            Assume(!(done_0 && done_1));
            cmp = FeeRateCompare(slope_ap, FeeFrac(0, 1));
        } else {
            // If both sides have points left, compute B, and the slope of AB explicitly.
            const FeeFrac& point_b = next_point(!unproc_side);
            const auto slope_ab = point_b - point_a;
            Assume(slope_ab.size >= slope_ap.size);
            cmp = FeeRateCompare(slope_ap, slope_ab);

            // If B and P have the same size, B can be marked as processed (in addition to P, see
            // below), as we've already performed a comparison at this size.
            if (point_b.size == point_p.size) advance(!unproc_side);
        }
        // If P lies above AB, unproc_side is better in P. If P lies below AB, then !unproc_side is
        // better in P.
        if (std::is_gt(cmp)) better_somewhere[unproc_side] = true;
        if (std::is_lt(cmp)) better_somewhere[!unproc_side] = true;
        advance(unproc_side);

        // If both diagrams are better somewhere, they are incomparable.
        if (better_somewhere[0] && better_somewhere[1]) return std::partial_ordering::unordered;
    } while(true);

    // Otherwise compare the better_somewhere values.
    return better_somewhere[0] <=> better_somewhere[1];
}